

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

int INT_CMwrite_raw_notify
              (CMConnection conn,FFSEncodeVector full_vec,FFSEncodeVector data_vec,long vec_count,
              size_t byte_count,attr_list attrs,int data_vec_stack,
              CMcompletion_notify_func notify_func,void *notify_client_data)

{
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  __pid_t _Var4;
  long lVar5;
  pthread_t pVar6;
  long lVar7;
  long in_RCX;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  undefined8 in_R9;
  int in_stack_00000008;
  code *in_stack_00000010;
  undefined8 in_stack_00000018;
  timespec ts_2;
  timespec ts_1;
  timespec ts;
  ssize_t actual_bytes;
  size_t length;
  size_t count;
  int start;
  int j;
  int i;
  uchar checksum;
  size_t actual;
  undefined4 local_98;
  CMTraceType in_stack_ffffffffffffff6c;
  CManager in_stack_ffffffffffffff70;
  CMbuffer in_stack_ffffffffffffff78;
  CManager_conflict in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  attr_list in_stack_ffffffffffffff90;
  FFSEncodeVector pbio_vec;
  FFSEncodeVector tmp_vec;
  int iVar8;
  int in_stack_ffffffffffffffb4;
  int local_48;
  byte local_41;
  uint local_4;
  
  iVar3 = 0;
  local_41 = 0;
  tmp_vec = (FFSEncodeVector)0x0;
  pbio_vec = (FFSEncodeVector)0x0;
  if (((int)in_RDI[5] == 0) && (*(int *)((long)in_RDI + 0x2c) == 0)) {
    if ((int)in_RDI[0x24] != 0) {
      iVar3 = 0;
      wait_for_pending_write((CMConnection)0x0);
    }
    for (local_48 = 0; local_48 < in_RCX; local_48 = local_48 + 1) {
      pbio_vec = (FFSEncodeVector)((long)&pbio_vec->iov_base + in_RSI[(long)local_48 * 2 + 1]);
    }
    iVar8 = 4;
    if (pbio_vec < (FFSEncodeVector)0x2800) {
      for (local_48 = 0; local_48 < in_RCX; local_48 = local_48 + 1) {
        tmp_vec = (FFSEncodeVector)((in_RSI[(long)local_48 * 2 + 1] - (long)iVar8) + (long)tmp_vec);
        for (in_stack_ffffffffffffffb4 = iVar8;
            (ulong)(long)in_stack_ffffffffffffffb4 < (ulong)in_RSI[(long)local_48 * 2 + 1];
            in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
          local_41 = local_41 +
                     *(char *)(in_RSI[(long)local_48 * 2] + (long)in_stack_ffffffffffffffb4);
        }
        iVar8 = 0;
      }
    }
    *(uint *)*in_RSI = *(uint *)*in_RSI & 0xffffff00 | (uint)local_41;
    if ((*(int *)((long)in_RDI + 0x124) == 1) && (*(long *)(in_RDI[1] + 0x80) != 0)) {
      iVar2 = (**(code **)(in_RDI[1] + 0x80))(&CMstatic_trans_svcs,in_RDI[2],in_RSI,in_RCX,in_R9);
      lVar5 = (long)iVar2;
      if (lVar5 < 0) {
        iVar2 = CMtrace_val[7];
        if (*(long *)(*in_RDI + 0x120) == 0) {
          iVar2 = CMtrace_init(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        }
        if (iVar2 != 0) {
          if (CMtrace_PID != 0) {
            pFVar1 = *(FILE **)(*in_RDI + 0x120);
            _Var4 = getpid();
            pVar6 = pthread_self();
            fprintf(pFVar1,"P%lxT%lx - ",(long)_Var4,pVar6);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&stack0xffffffffffffff88);
            fprintf(*(FILE **)(*in_RDI + 0x120),"%lld.%.9ld - ",in_stack_ffffffffffffff88,
                    in_stack_ffffffffffffff90);
          }
          fprintf(*(FILE **)(*in_RDI + 0x120),
                  "Calling write failed connection failed with dereference %p\n",in_RDI);
        }
        fflush(*(FILE **)(*in_RDI + 0x120));
        INT_CMConnection_failed((CMConnection)in_stack_ffffffffffffff80);
        if (in_RDI[0x23] != 0) {
          cm_return_data_buf(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
          in_RDI[0x23] = 0;
        }
        *(undefined4 *)(in_RDI + 0x24) = 0;
        (**(code **)(in_RDI[1] + 0x90))(in_RDI[1],&CMstatic_trans_svcs,in_RDI[2],0);
        cm_wake_any_pending_write((CMConnection)count);
      }
      lVar7 = in_RCX;
      if (lVar5 < (long)pbio_vec) {
        if (lVar5 < 0) {
          lVar5 = 0;
        }
        if (in_stack_00000008 != 0) {
          copy_vector_to_FFSBuffer(in_RDI[4],in_RDX);
        }
        queue_remaining_write
                  ((CMConnection)CONCAT44(in_stack_ffffffffffffffb4,iVar8),tmp_vec,pbio_vec,
                   (int)((ulong)lVar5 >> 0x20),in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                   iVar3);
        (**(code **)(in_RDI[1] + 0x90))(in_RDI[1],&CMstatic_trans_svcs,in_RDI[2],1);
        *(undefined4 *)(in_RDI + 0x24) = 1;
        iVar3 = CMtrace_val[3];
        if (*(long *)(*in_RDI + 0x120) == 0) {
          iVar3 = CMtrace_init(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        }
        if (iVar3 != 0) {
          if (CMtrace_PID != 0) {
            pFVar1 = *(FILE **)(*in_RDI + 0x120);
            _Var4 = getpid();
            pVar6 = pthread_self();
            fprintf(pFVar1,"P%lxT%lx - ",(long)_Var4,pVar6);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&stack0xffffffffffffff78);
            fprintf(*(FILE **)(*in_RDI + 0x120),"%lld.%.9ld - ",in_stack_ffffffffffffff78,
                    in_stack_ffffffffffffff80);
          }
          fprintf(*(FILE **)(*in_RDI + 0x120),"Partial write, queued %zd bytes\n",
                  (long)pbio_vec - lVar5);
        }
        fflush(*(FILE **)(*in_RDI + 0x120));
        return 1;
      }
    }
    else if ((*(long *)(in_RDI[1] + 0x88) == 0) || (in_stack_00000010 == (code *)0x0)) {
      iVar3 = (**(code **)(in_RDI[1] + 0x78))(&CMstatic_trans_svcs,in_RDI[2],in_RSI,in_RCX,in_R9);
      lVar7 = (long)iVar3;
      if (lVar7 == 0) {
        iVar3 = CMtrace_val[7];
        if (*(long *)(*in_RDI + 0x120) == 0) {
          iVar3 = CMtrace_init(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        }
        if (iVar3 != 0) {
          if (CMtrace_PID != 0) {
            pFVar1 = *(FILE **)(*in_RDI + 0x120);
            _Var4 = getpid();
            pVar6 = pthread_self();
            fprintf(pFVar1,"P%lxT%lx - ",(long)_Var4,pVar6);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&local_98);
            fprintf(*(FILE **)(*in_RDI + 0x120),"%lld.%.9ld - ",
                    CONCAT44(in_stack_ffffffffffffff6c,local_98),in_stack_ffffffffffffff70);
          }
          fprintf(*(FILE **)(*in_RDI + 0x120),
                  "Calling write failed connection failed with dereference %p\n",in_RDI);
        }
        fflush(*(FILE **)(*in_RDI + 0x120));
        INT_CMConnection_failed((CMConnection)in_stack_ffffffffffffff80);
      }
      if (in_stack_00000010 != (code *)0x0) {
        (*in_stack_00000010)(in_stack_00000018);
      }
    }
    else {
      iVar3 = (**(code **)(in_RDI[1] + 0x88))
                        (&CMstatic_trans_svcs,in_RDI[2],in_RSI,in_RCX,in_R9,in_stack_00000010,
                         in_stack_00000018);
      lVar7 = (long)iVar3;
    }
    local_4 = (uint)(lVar7 == in_RCX);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
 INT_CMwrite_raw_notify(CMConnection conn, FFSEncodeVector full_vec, FFSEncodeVector data_vec,
			long vec_count, size_t byte_count, attr_list attrs, int data_vec_stack,
			CMcompletion_notify_func notify_func, void *notify_client_data)
 {
     size_t actual = 0;
     unsigned char checksum = 0;
     int i, j, start;
     size_t count = 0;
     size_t length = 0;
     if (conn->closed || conn->failed) return 0;

     if (conn->write_pending) {
	 wait_for_pending_write(conn);
     }
     for (i=0; i < vec_count; i++) {
	 length += full_vec[i].iov_len;
     }
     start = 4;
     if (length < 10240) {
	 /* do checksum for small messages */
	 for (i=0; i < vec_count; i++) {
	     count += full_vec[i].iov_len - start;
	     for (j=start; j< full_vec[i].iov_len; j++) {
		 checksum += ((unsigned char*)full_vec[i].iov_base)[j];
	     }
	     start = 0;
	 }
     }
     ((int*)full_vec[0].iov_base)[0] = 
	 (((int*)full_vec[0].iov_base)[0] & 0xffffff00) | (unsigned char) checksum;
     if ((conn->do_non_blocking_write == 1) && (conn->trans->NBwritev_func)) {
	 ssize_t actual_bytes;
	 actual_bytes = 
	     conn->trans->NBwritev_func(&CMstatic_trans_svcs, 
					     conn->transport_data, 
					     full_vec, vec_count, attrs);
	 if (actual_bytes < 0) {
	     CMtrace_out(conn->cm, CMFreeVerbose, "Calling write failed connection failed with dereference %p\n", conn);
	     INT_CMConnection_failed(conn);
	     if (conn->queued_data.buffer_to_free) {
		 cm_return_data_buf(conn->cm, conn->queued_data.buffer_to_free);
		 conn->queued_data.buffer_to_free = NULL;
	     }
	     conn->write_pending = 0;
	     conn->trans->set_write_notify(conn->trans, &CMstatic_trans_svcs, 
					   conn->transport_data, 0);
	     cm_wake_any_pending_write(conn);
	 }
	 if (actual_bytes < (ssize_t)length) {
	     /* copy remaining and send it later */
	     if (actual_bytes < 0 ) actual_bytes = 0;
	     if (data_vec_stack) {
		 data_vec = copy_vector_to_FFSBuffer(conn->io_out_buffer, data_vec);
	     }
	     queue_remaining_write(conn, full_vec, data_vec, vec_count, 
				   attrs, actual_bytes, attrs != NULL);
	     conn->trans->set_write_notify(conn->trans, &CMstatic_trans_svcs, conn->transport_data, 1);
	     conn->write_pending = 1;
	     CMtrace_out(conn->cm, CMLowLevelVerbose, 
			 "Partial write, queued %zd bytes\n",
			 length - actual_bytes);
	     return 1;
	 }
	 actual = vec_count;  /* set actual for success */
     } else if (conn->trans->writev_complete_notify_func && notify_func) {
	 actual = conn->trans->writev_complete_notify_func(&CMstatic_trans_svcs, 
							   conn->transport_data, 
							   full_vec, vec_count, 
							   attrs, notify_func, notify_client_data);
     } else {
	 actual = conn->trans->writev_func(&CMstatic_trans_svcs, 
					   conn->transport_data, 
					   full_vec, vec_count, attrs);
	 if (actual <= 0) {
	     CMtrace_out(conn->cm, CMFreeVerbose, "Calling write failed connection failed with dereference %p\n", conn);
	     INT_CMConnection_failed(conn);
	 }
	 if (notify_func) {
	     (notify_func)(notify_client_data);
	 }
     }
     return actual == vec_count ? 1 : 0;
 }